

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void down_box_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  Fl_Widget_Type *q_2;
  Fl_Widget_Type *q_1;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n_1;
  int m;
  int mod;
  int j;
  int n;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if ((iVar3 == 0) ||
       (iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar3 != 0)) {
      iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"Fl_Input_Choice");
      if (iVar3 == 0) {
        mod = Fl_Input_Choice::down_box((Fl_Input_Choice *)current_widget->o);
      }
      else {
        iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1f])();
        if (iVar3 == 0) {
          Fl_Widget::deactivate((Fl_Widget *)i);
          return;
        }
        mod = Fl_Menu_::down_box((Fl_Menu_ *)current_widget->o);
      }
    }
    else {
      mod = Fl_Button::down_box((Fl_Button *)current_widget->o);
    }
    Fl_Widget::activate((Fl_Widget *)i);
    if (mod == 0) {
      mod = 1000;
    }
    for (m = 0; m < 0x3d; m = m + 1) {
      lVar4 = Fl_Menu_Item::argument(boxmenu + m);
      if (lVar4 == mod) {
        Fl_Choice::value(i,m);
        return;
      }
    }
  }
  else {
    bVar1 = false;
    iVar3 = Fl_Choice::value(i);
    lVar4 = Fl_Menu_Item::argument(boxmenu + iVar3);
    o._4_4_ = (Fl_Boxtype)lVar4;
    if (o._4_4_ != FL_NO_BOX) {
      if (o._4_4_ == 1000) {
        o._4_4_ = FL_NO_BOX;
      }
      for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
          q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
        if ((q->super_Fl_Type).selected != '\0') {
          iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x18])();
          if ((iVar3 == 0) || (iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1e])(), iVar3 != 0)) {
            iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[5])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"Fl_Input_Choice");
            if (iVar3 == 0) {
              Fl_Input_Choice::down_box((Fl_Input_Choice *)q->o,o._4_4_);
            }
            else {
              iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1f])();
              if (iVar3 != 0) {
                Fl_Menu_::down_box((Fl_Menu_ *)q->o,o._4_4_);
              }
            }
          }
          else {
            Fl_Button::down_box((Fl_Button *)q->o,o._4_4_);
            cVar2 = Fl_Button::value((Fl_Button *)q->o);
            if (cVar2 != '\0') {
              Fl_Widget_Type::redraw(q);
            }
          }
          bVar1 = true;
        }
      }
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void down_box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    if (current_widget->is_button() && !current_widget->is_menu_item())
      n = ((Fl_Button*)(current_widget->o))->down_box();
    else if (!strcmp(current_widget->type_name(), "Fl_Input_Choice"))
      n = ((Fl_Input_Choice*)(current_widget->o))->down_box();
    else if (current_widget->is_menu_button())
      n = ((Fl_Menu_*)(current_widget->o))->down_box();
    else {
      i->deactivate(); return;
    }
    i->activate();
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected) {
	if (o->is_button() && !o->is_menu_item()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Button*)(q->o))->down_box((Fl_Boxtype)n);
          if (((Fl_Button*)(q->o))->value()) q->redraw();
	} else if (!strcmp(o->type_name(), "Fl_Input_Choice")) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	  ((Fl_Input_Choice*)(q->o))->down_box((Fl_Boxtype)n);
	} else if (o->is_menu_button()) {
	  Fl_Widget_Type* q = (Fl_Widget_Type*)o;
          ((Fl_Menu_*)(q->o))->down_box((Fl_Boxtype)n);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}